

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> __thiscall
slang::parseList(slang *this,string_view value,bool allowCommaList,
                SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem)

{
  slang *psVar1;
  size_t sVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *this_00
  ;
  slang *psVar4;
  size_type __n;
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  this_00 = (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             *)CONCAT71(in_register_00000009,allowCommaList);
  __s = (char *)value._M_len;
  local_48._M_len = (size_t)this;
  local_48._M_str = __s;
  if ((this != (slang *)0x0 & (byte)value._M_str) == 1) {
    do {
      sVar2 = local_48._M_len;
      local_48._M_str = __s;
      pvVar3 = memchr(__s,0x2c,local_48._M_len);
      if ((pvVar3 == (void *)0x0) ||
         (psVar4 = (slang *)((long)pvVar3 - (long)__s), psVar4 == (slang *)0xffffffffffffffff))
      break;
      local_38._M_len = (size_t)psVar4;
      if (sVar2 < psVar4) {
        local_38._M_len = sVar2;
      }
      local_38._M_str = __s;
      SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
                 &local_38);
      psVar1 = psVar4 + 1;
      if (sVar2 <= psVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar1,sVar2);
      }
      __s = __s + (long)psVar1;
      local_48._M_len = sVar2 + -(long)psVar1;
      local_48._M_str = __s;
    } while ((slang *)local_48._M_len != (slang *)0x0);
  }
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
            ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
             &local_48);
  return *this_00;
}

Assistant:

static std::span<const std::string_view> parseList(std::string_view value, bool allowCommaList,
                                                   SmallVector<std::string_view>& splitMem) {
    if (allowCommaList) {
        while (true) {
            auto index = value.find_first_of(',');
            if (index == std::string_view::npos)
                break;

            splitMem.push_back(value.substr(0, index));
            value = value.substr(index + 1);
        }
    }
    splitMem.push_back(value);
    return splitMem;
}